

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O0

bool helics::isDisconnectCommand(ActionMessage *command)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RDI;
  TimeRepresentation<count_time<9,_long>_> local_18;
  ActionMessage *local_10;
  
  local_10 = in_RDI;
  aVar2 = ActionMessage::action(in_RDI);
  if (((aVar2 != cmd_priority_disconnect) &&
      (7 < (uint)(aVar2 + (cmd_route_ack|cmd_init_not_ready|cmd_user_disconnect)))) &&
     (1 < (uint)(aVar2 + (cmd_add_route|cmd_user_disconnect)))) {
    if (aVar2 == cmd_time_grant) {
      local_18 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&local_10->actionTime,&local_18);
      return bVar1;
    }
    if (((aVar2 != cmd_remove_filter) && (aVar2 != cmd_remove_endpoint)) &&
       ((aVar2 != cmd_disconnect_fed_ack &&
        (aVar2 != cmd_disconnect_core_ack && aVar2 != cmd_disconnect_broker_ack)))) {
      return false;
    }
  }
  return true;
}

Assistant:

inline bool isDisconnectCommand(const ActionMessage& command) noexcept
{
    switch (command.action()) {
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_CHECK:
        case CMD_DISCONNECT_NAME:
        case CMD_USER_DISCONNECT:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CORE:
        case CMD_PRIORITY_DISCONNECT:
        case CMD_TERMINATE_IMMEDIATELY:
        case CMD_REMOVE_FILTER:
        case CMD_REMOVE_ENDPOINT:
        case CMD_DISCONNECT_FED_ACK:
        case CMD_DISCONNECT_CORE_ACK:
        case CMD_DISCONNECT_BROKER_ACK:
        case CMD_DISCONNECT_BROKER:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_STOP:
            return true;
        case CMD_TIME_GRANT:
            return (command.actionTime == Time::maxVal());
        default:
            return false;
    }
}